

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  ulong uVar2;
  byte *pbVar3;
  MemoryStream *pMVar4;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  ParseResult PVar5;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  pMVar4 = is->is_;
  pbVar3 = (byte *)pMVar4->src_;
  while (((pbVar3 != (byte *)pMVar4->end_ && ((ulong)*pbVar3 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    pMVar4->src_ = (Ch *)pbVar3;
  }
  uVar2 = 1;
  if ((pbVar3 != (byte *)pMVar4->end_) && (*pbVar3 != 0)) {
    ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    uVar2 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_00144ed1;
    pMVar4 = is->is_;
    pbVar3 = (byte *)pMVar4->src_;
    while (((pbVar3 != (byte *)pMVar4->end_ && ((ulong)*pbVar3 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
      pMVar4->src_ = (Ch *)pbVar3;
    }
    uVar2 = 0;
    if ((pbVar3 == (byte *)pMVar4->end_) || (*pbVar3 == 0)) goto LAB_00144ed1;
    uVar2 = 2;
  }
  pCVar1 = pMVar4->begin_;
  *(int *)(this + 0x30) = (int)uVar2;
  *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar1;
LAB_00144ed1:
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar5.offset_ = *(size_t *)(this + 0x38);
  PVar5._0_8_ = uVar2;
  return PVar5;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }